

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cpp
# Opt level: O0

void do_test<void(),main::__10,main::__11>
               (string *name,anon_class_1_0_00000001 *init,anon_class_1_0_00000001 *test)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 local_90 [8];
  function<void_()> f_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  function<void_()> f;
  anon_class_1_0_00000001 *test_local;
  anon_class_1_0_00000001 *init_local;
  string *name_local;
  
  f._M_invoker = (_Invoker_type)test;
  std::function<void_()>::function((function<void_()> *)local_40);
  std::operator+(&local_60,name," (std::function)");
  do_test_impl<std::function<void()>,main::__10,main::__11>
            (&local_60,(function<void_()> *)local_40,init,(anon_class_1_0_00000001 *)f._M_invoker);
  std::__cxx11::string::~string((string *)&local_60);
  std::function<void_()>::~function((function<void_()> *)local_40);
  function<void_()>::function((function<void_()> *)local_90);
  std::operator+(&local_b0,name," (function)");
  do_test_impl<function<void()>,main::__10,main::__11>
            (&local_b0,(function<void_()> *)local_90,init,(anon_class_1_0_00000001 *)f._M_invoker);
  std::__cxx11::string::~string((string *)&local_b0);
  function<void_()>::~function((function<void_()> *)local_90);
  return;
}

Assistant:

void do_test(std::string const & name, InitFunc && init, TestFunc && test)
{
	{
		std::function<Signature> f;
		do_test_impl(name + " (std::function)", f, std::forward<InitFunc>(init), std::forward<TestFunc>(test));
	}

	{
		function<Signature> f;
		do_test_impl(name + " (function)", f, std::forward<InitFunc>(init), std::forward<TestFunc>(test));
	}
}